

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManResolve(Cbs2_Man_t *p,int Level,int hClause0,int hClause1)

{
  int iVar1;
  Cbs2_Que_t *p_00;
  bool bVar2;
  int local_34;
  int LevelCur;
  int LevelMax;
  int iObj;
  int i;
  Cbs2_Que_t *pQue;
  int hClause1_local;
  int hClause0_local;
  int Level_local;
  Cbs2_Man_t *p_local;
  
  p_00 = &p->pClauses;
  local_34 = -1;
  if ((p->pClauses).pData[hClause0 + 1] == 0) {
    __assert_fail("pQue->pData[hClause0+1] != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x39d,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  if ((p->pClauses).pData[hClause0 + 1] != (p->pClauses).pData[hClause1 + 1]) {
    __assert_fail("pQue->pData[hClause0+1] == pQue->pData[hClause1+1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x39e,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  iVar1 = Cbs2_QueIsEmpty(p_00);
  if (iVar1 == 0) {
    __assert_fail("Cbs2_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x3a3,"int Cbs2_ManResolve(Cbs2_Man_t *, int, int, int)");
  }
  Cbs2_QuePush(p_00,0);
  Cbs2_QuePush(p_00,0);
  LevelMax = 2;
  while( true ) {
    iVar1 = Cbs2_ClauseSize(p,hClause0);
    bVar2 = false;
    if (LevelMax <= iVar1) {
      LevelCur = (p->pClauses).pData[hClause0 + LevelMax];
      bVar2 = LevelCur != 0;
    }
    if (!bVar2) break;
    iVar1 = Cbs2_VarMark0(p,LevelCur);
    if (iVar1 == 0) {
      Cbs2_VarSetMark0(p,LevelCur,1);
      Cbs2_QuePush(p_00,LevelCur);
      iVar1 = Cbs2_VarDecLevel(p,LevelCur);
      if (local_34 < iVar1) {
        local_34 = iVar1;
      }
    }
    LevelMax = LevelMax + 1;
  }
  LevelMax = 2;
  while( true ) {
    iVar1 = Cbs2_ClauseSize(p,hClause1);
    bVar2 = false;
    if (LevelMax <= iVar1) {
      LevelCur = (p->pClauses).pData[hClause1 + LevelMax];
      bVar2 = LevelCur != 0;
    }
    if (!bVar2) break;
    iVar1 = Cbs2_VarMark0(p,LevelCur);
    if (iVar1 == 0) {
      Cbs2_VarSetMark0(p,LevelCur,1);
      Cbs2_QuePush(p_00,LevelCur);
      iVar1 = Cbs2_VarDecLevel(p,LevelCur);
      if (local_34 < iVar1) {
        local_34 = iVar1;
      }
    }
    LevelMax = LevelMax + 1;
  }
  for (LevelMax = p_00->iHead + 2; LevelMax < (p->pClauses).iTail; LevelMax = LevelMax + 1) {
    Cbs2_VarSetMark0(p,(p->pClauses).pData[LevelMax],0);
  }
  iVar1 = Cbs2_ManDeriveReason(p,local_34);
  return iVar1;
}

Assistant:

static inline int Cbs2_ManResolve( Cbs2_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Cbs2_Que_t * pQue = &(p->pClauses);
    int i, iObj, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0+1] != 0 );
    assert( pQue->pData[hClause0+1] == pQue->pData[hClause1+1] );
    //Cbs2_ClauseForEachEntry1( p, hClause0, iObj, i )
    //    assert( !Cbs2_VarMark0(p, iObj) );
    //Cbs2_ClauseForEachEntry1( p, hClause1, iObj, i )
    //    assert( !Cbs2_VarMark0(p, iObj) );
    assert( Cbs2_QueIsEmpty( pQue ) );
    Cbs2_QuePush( pQue, 0 );
    Cbs2_QuePush( pQue, 0 );
//    for ( i = hClause0 + 1; (iObj = pQue->pData[i]); i++ )
    Cbs2_ClauseForEachEntry1( p, hClause0, iObj, i )
    {
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Cbs2_QuePush( pQue, iObj );
        LevelCur = Cbs2_VarDecLevel( p, iObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
//    for ( i = hClause1 + 1; (iObj = pQue->pData[i]); i++ )
    Cbs2_ClauseForEachEntry1( p, hClause1, iObj, i )
    {
        if ( Cbs2_VarMark0(p, iObj) ) // unassigned - seen again
            continue;
        //if ( Vec_IntEntry(&p->vActivity, iObj) == 0 )
        //    Vec_IntPush( &p->vActStore, iObj );
        //Vec_IntAddToEntry( &p->vActivity, iObj, 1 );
        // assigned - seen first time
        Cbs2_VarSetMark0(p, iObj, 1);
        Cbs2_QuePush( pQue, iObj );
        LevelCur = Cbs2_VarDecLevel( p, iObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 2; i < pQue->iTail; i++ )
        Cbs2_VarSetMark0(p, pQue->pData[i], 0);
    return Cbs2_ManDeriveReason( p, LevelMax );
}